

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visit_suite.cpp
# Opt level: O0

void explicit_suite::visit_string(void)

{
  undefined4 local_114;
  value local_110;
  visitor local_109;
  undefined1 local_108 [7];
  visitor vis_3;
  variable data_3;
  value local_d0;
  visitor local_c9;
  undefined1 local_c8 [7];
  visitor vis_2;
  variable data_2;
  value local_90;
  visitor local_89;
  undefined1 local_88 [7];
  visitor vis_1;
  variable data_1;
  undefined4 local_50 [4];
  value local_40;
  visitor local_39;
  undefined1 local_38 [7];
  visitor vis;
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38,"alpha");
  local_40 = trial::dynamic::visit<explicit_suite::visitor&,std::allocator<char>>
                       (&local_39,(basic_variable<std::allocator<char>_> *)local_38);
  local_50[0] = 0xf;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::dynamic::token::code::value,trial::dynamic::token::code::value>
            ("visit(vis, data)","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/visit_suite.cpp"
             ,0xea,"void explicit_suite::visit_string()",&local_40,local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_88,L"bravo");
  local_90 = trial::dynamic::visit<explicit_suite::visitor&,std::allocator<char>>
                       (&local_89,(basic_variable<std::allocator<char>_> *)local_88);
  data_2.storage._44_4_ = 0x10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::dynamic::token::code::value,trial::dynamic::token::code::value>
            ("visit(vis, data)","token::code::wstring",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/visit_suite.cpp"
             ,0xef,"void explicit_suite::visit_string()",&local_90,&data_2.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_88);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_c8,L"charlie");
  local_d0 = trial::dynamic::visit<explicit_suite::visitor&,std::allocator<char>>
                       (&local_c9,(basic_variable<std::allocator<char>_> *)local_c8);
  data_3.storage._44_4_ = 0x11;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::dynamic::token::code::value,trial::dynamic::token::code::value>
            ("visit(vis, data)","token::code::u16string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/visit_suite.cpp"
             ,0xf4,"void explicit_suite::visit_string()",&local_d0,&data_3.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_108,L"delta");
  local_110 = trial::dynamic::visit<explicit_suite::visitor&,std::allocator<char>>
                        (&local_109,(basic_variable<std::allocator<char>_> *)local_108);
  local_114 = 0x12;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::dynamic::token::code::value,trial::dynamic::token::code::value>
            ("visit(vis, data)","token::code::u32string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/visit_suite.cpp"
             ,0xf9,"void explicit_suite::visit_string()",&local_110,&local_114);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_108);
  return;
}

Assistant:

void visit_string()
{
    {
        variable data("alpha");
        visitor vis;
        TRIAL_PROTOCOL_TEST_EQUAL(visit(vis, data), token::code::string);
    }
    {
        variable data(L"bravo");
        visitor vis;
        TRIAL_PROTOCOL_TEST_EQUAL(visit(vis, data), token::code::wstring);
    }
    {
        variable data(u"charlie");
        visitor vis;
        TRIAL_PROTOCOL_TEST_EQUAL(visit(vis, data), token::code::u16string);
    }
    {
        variable data(U"delta");
        visitor vis;
        TRIAL_PROTOCOL_TEST_EQUAL(visit(vis, data), token::code::u32string);
    }
}